

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O0

BuiltinVariable * deserializeBuiltinVar(QDataStream *stream,int version)

{
  reference piVar1;
  int in_EDX;
  QDataStream *in_RSI;
  BuiltinVariable *in_RDI;
  long in_FS_OFFSET;
  int i;
  BuiltinVariable *var;
  int count;
  int t;
  QDataStream *this;
  BuiltinVariable *size;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar2;
  int local_10;
  BuiltinType local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->arrayDims).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->arrayDims).d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->arrayDims).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  size = in_RDI;
  QShaderDescription::BuiltinVariable::BuiltinVariable((BuiltinVariable *)0x6e29f2);
  local_c = 0xaaaaaaaa;
  QDataStream::operator>>(in_RSI,(int *)&local_c);
  size->type = local_c;
  if (8 < in_EDX) {
    QDataStream::operator>>(in_RSI,(int *)&local_c);
    size->varType = local_c;
    local_10 = -0x55555556;
    QDataStream::operator>>(in_RSI,&local_10);
    QList<int>::resize((QList<int> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (qsizetype)size);
    for (iVar2 = 0; iVar2 < local_10; iVar2 = iVar2 + 1) {
      this = in_RSI;
      piVar1 = QList<int>::operator[]((QList<int> *)in_RDI,(qsizetype)in_RSI);
      QDataStream::operator>>(this,piVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QShaderDescription::BuiltinVariable deserializeBuiltinVar(QDataStream *stream, int version)
{
    QShaderDescription::BuiltinVariable var;
    int t;
    (*stream) >> t;
    var.type = QShaderDescription::BuiltinType(t);
    if (version > QShaderPrivate::QSB_VERSION_WITHOUT_INPUT_OUTPUT_INTERFACE_BLOCKS) {
        (*stream) >> t;
        var.varType = QShaderDescription::VariableType(t);
        int count;
        (*stream) >> count;
        var.arrayDims.resize(count);
        for (int i = 0; i < count; ++i)
            (*stream) >> var.arrayDims[i];
    }
    return var;
}